

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

void __thiscall BasicBlock::CleanUpValueMaps(BasicBlock *this)

{
  ExprHash EVar1;
  Type TVar2;
  GlobOpt *pGVar3;
  JitArenaAllocator *pJVar4;
  Value *pVVar5;
  ValueInfo *this_00;
  ExprHashTable *pEVar6;
  undefined1 auVar7 [8];
  code *pcVar8;
  SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *pSVar9;
  bool bVar10;
  BOOLEAN BVar11;
  undefined4 *puVar12;
  Type *ppOVar13;
  StackSym *pSVar14;
  Type *pTVar15;
  StackSym *pSVar16;
  Type *pTVar17;
  Value *pVVar18;
  Sym *sym;
  BVSparse<Memory::JitArenaAllocator> *pBVar19;
  Type_conflict pBVar20;
  BVSparseNode *pBVar21;
  undefined4 *puVar22;
  ulong uVar23;
  Type_conflict pBVar24;
  BVSparseNode *pBVar25;
  GlobHashTable *pGVar26;
  Type pBVar27;
  uint uVar28;
  BasicBlock *pBVar29;
  ulong uVar30;
  uint key;
  BVSparse<Memory::JitArenaAllocator> local_138;
  JitArenaAllocator *local_110;
  BVSparse<Memory::JitArenaAllocator> local_108;
  BVSparse<Memory::JitArenaAllocator> local_e8;
  BVSparse<Memory::JitArenaAllocator> *local_c0;
  BVSparse<Memory::JitArenaAllocator> *local_b8;
  Loop *local_b0;
  BVSparse<Memory::JitArenaAllocator> local_a8;
  GlobOptBlockData *local_80;
  undefined4 *local_78;
  GlobHashTable *local_70;
  undefined1 auStack_68 [8];
  EditingIterator iter;
  
  local_80 = &this->globOptData;
  pGVar3 = (this->globOptData).globOpt;
  pBVar29 = this;
  do {
    pBVar29 = pBVar29->next;
    if (pBVar29 == (BasicBlock *)0x0) goto LAB_0041aca3;
  } while ((*(ushort *)&pBVar29->field_0x18 & 1) != 0);
  if (((*(ushort *)&pBVar29->field_0x18 & 4) == 0 || pBVar29->loop == (Loop *)0x0) ||
     (pBVar29->loop->landingPad != this)) {
LAB_0041aca3:
    uVar28 = DAT_0159efd8;
    if ((*(uint *)&pGVar3->field_0xf4 >> 0x19 & 1) == 0) {
      uVar28 = DAT_0159efd4;
    }
    if (pGVar3->instrCountSinceLastCleanUp < uVar28) {
      return;
    }
  }
  pGVar3->instrCountSinceLastCleanUp = 0;
  pJVar4 = pGVar3->tempAlloc;
  local_70 = local_80->symToValueMap;
  local_a8.lastUsedNodePrevNextField = &local_a8.head;
  local_a8.head = (BVSparseNode *)0x0;
  local_a8.lastFoundIndex = (Type_conflict)0x0;
  local_108.lastUsedNodePrevNextField = &local_108.head;
  local_108.head = (BVSparseNode *)0x0;
  local_108.lastFoundIndex = (Type_conflict)0x0;
  local_e8.lastUsedNodePrevNextField = &local_e8.head;
  local_e8.head = (BVSparseNode *)0x0;
  local_e8.lastFoundIndex = (Type_conflict)0x0;
  pBVar19 = pGVar3->byteCodeConstantValueNumbersBv;
  local_108.alloc = pJVar4;
  local_e8.alloc = pJVar4;
  local_a8.alloc = pJVar4;
  BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar19);
  BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
            (&local_e8,pBVar19->head);
  local_b0 = this->loop;
  local_c0 = this->upwardExposedUses;
  local_b8 = this->upwardExposedFields;
  local_138.lastUsedNodePrevNextField = &local_138.head;
  local_138.head = (BVSparseNode *)0x0;
  local_138.lastFoundIndex = (Type_conflict)0x0;
  pBVar24 = (Type_conflict)(this->globOptData).callSequence;
  local_138.alloc = pJVar4;
  local_110 = pJVar4;
  if ((pBVar24 != (Type_conflict)0x0) &&
     ((Type_conflict)((SListNodeBase<Memory::ArenaAllocator> *)&pBVar24->next)->next != pBVar24)) {
    auStack_68 = (undefined1  [8])pBVar24;
    iter.super_Iterator.list =
         (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)pBVar24;
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    while( true ) {
      if (pBVar24 == (Type_conflict)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                            ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar10) goto LAB_0041b8fa;
        *puVar12 = 0;
        pBVar24 = (Type_conflict)iter.super_Iterator.list;
      }
      pBVar24 = (Type_conflict)((SListNodeBase<Memory::ArenaAllocator> *)&pBVar24->next)->next;
      if ((undefined1  [8])pBVar24 == auStack_68) break;
      iter.super_Iterator.list =
           (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)pBVar24;
      ppOVar13 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)auStack_68);
      pSVar14 = IR::Opnd::GetStackSym(*ppOVar13);
      BVSparse<Memory::JitArenaAllocator>::Set(&local_138,(pSVar14->super_Sym).m_id);
      pBVar24 = (Type_conflict)iter.super_Iterator.list;
    }
  }
  pGVar26 = local_70;
  if (local_70->tableSize != 0) {
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    puVar22 = (undefined4 *)0x0;
    do {
      auStack_68 = (undefined1  [8])(pGVar26->table + (long)puVar22);
      iter.super_Iterator.current = (NodeBase *)0x0;
      local_78 = puVar22;
      iter.super_Iterator.list =
           (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)auStack_68;
LAB_0041ae68:
      bVar10 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
               EditingIterator::Next((EditingIterator *)auStack_68);
      if (bVar10) {
        pTVar15 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator
                  ::Data((Iterator *)auStack_68);
        pSVar14 = (StackSym *)pTVar15->value;
        BVar11 = BVSparse<Memory::JitArenaAllocator>::Test(local_c0,(pSVar14->super_Sym).m_id);
        bVar10 = true;
        if ((BVar11 == '\0') &&
           (BVar11 = BVSparse<Memory::JitArenaAllocator>::Test(local_b8,(pSVar14->super_Sym).m_id),
           BVar11 == '\0')) goto LAB_0041b0f0;
        goto LAB_0041aeb5;
      }
      puVar22 = (undefined4 *)((long)local_78 + 1);
      pGVar26 = local_70;
    } while (puVar22 < (undefined4 *)(ulong)local_70->tableSize);
  }
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
            (&local_a8,&local_108);
  pEVar6 = (this->globOptData).exprToValueMap;
  local_b0 = (Loop *)CONCAT71(local_b0._1_7_,(this->globOptData).hasCSECandidates);
  (this->globOptData).hasCSECandidates = false;
  pBVar27 = local_a8.head;
  if (pEVar6->tableSize != 0) {
    local_78 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar23 = 0;
    do {
      auStack_68 = (undefined1  [8])(pEVar6->table + uVar23);
      iter.super_Iterator.current = (NodeBase *)0x0;
      iter.super_Iterator.list =
           (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)auStack_68;
      while (bVar10 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                      EditingIterator::Next((EditingIterator *)auStack_68), bVar10) {
        pTVar17 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                  Iterator::Data((Iterator *)auStack_68);
        EVar1 = pTVar17->value;
        uVar28 = (uint)EVar1 >> 8 & 0x7ff;
        if ((((uVar28 == 0) ||
             (BVar11 = BVSparse<Memory::JitArenaAllocator>::Test(&local_e8,uVar28), BVar11 != '\0'))
            && ((uVar28 = (uint)EVar1 >> 0x13 & 0x7ff, uVar28 == 0 ||
                (BVar11 = BVSparse<Memory::JitArenaAllocator>::Test(&local_e8,uVar28),
                BVar11 != '\0')))) &&
           ((((pVVar5 = pTVar17->element, pVVar5 != (Value *)0x0 &&
              (pSVar14 = (StackSym *)pVVar5->valueInfo->symStore, pSVar14 != (StackSym *)0x0)) &&
             (pVVar18 = GlobOptBlockData::FindValue(local_80,(Sym *)pSVar14),
             pVVar18 != (Value *)0x0)) && (pVVar18->valueNumber == pVVar5->valueNumber)))) {
          BVSparse<Memory::JitArenaAllocator>::Clear(&local_a8,(pSVar14->super_Sym).m_id);
          if (((pSVar14->super_Sym).m_kind == SymKindStack) &&
             (bVar10 = StackSym::HasObjectTypeSym(pSVar14), bVar10)) {
            if ((pSVar14->super_Sym).m_kind != SymKindStack) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *local_78 = 1;
              bVar10 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                  ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
              if (!bVar10) goto LAB_0041b8fa;
              *local_78 = 0;
            }
            pSVar14 = StackSym::GetObjectTypeSym(pSVar14);
            BVSparse<Memory::JitArenaAllocator>::Clear(&local_a8,(pSVar14->super_Sym).m_id);
          }
          (this->globOptData).hasCSECandidates = local_b0._0_1_;
        }
        else {
          pSVar9 = iter.super_Iterator.list;
          pJVar4 = pEVar6->alloc;
          SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
          EditingIterator::UnlinkCurrentNode((EditingIterator *)auStack_68);
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)pJVar4,
                     pSVar9,0x18);
        }
      }
      uVar23 = uVar23 + 1;
      pBVar27 = local_a8.head;
    } while (uVar23 < pEVar6->tableSize);
  }
  for (; pJVar4 = local_110, pBVar27 != (BVSparseNode *)0x0; pBVar27 = pBVar27->next) {
    uVar23 = (pBVar27->data).word;
    if (uVar23 != 0) {
      TVar2 = pBVar27->startIndex;
      uVar30 = 0;
      if (uVar23 != 0) {
        for (; (uVar23 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
        }
      }
      do {
        BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar30);
        key = (BVIndex)uVar30 + TVar2;
        ValueHashTable<Sym_*,_Value_*>::Clear(local_70,key);
        sym = SymTable::Find(this->func->m_symTable,key);
        GlobOptBlockData::SetChangedSym(local_80,sym);
        uVar23 = uVar23 & ~(1L << (uVar30 & 0x3f));
        uVar30 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
          }
        }
      } while (uVar23 != 0);
    }
  }
  pBVar19 = &local_a8;
  do {
    pBVar19 = (BVSparse<Memory::JitArenaAllocator> *)pBVar19->head;
    if (pBVar19 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0041b7b2;
  } while (((Type *)&pBVar19->alloc)->word == 0);
  bVar10 = Func::IsJitInDebugMode(this->func);
  if (!bVar10) {
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              ((this->globOptData).liveVarSyms,&local_a8);
LAB_0041b779:
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              ((this->globOptData).liveInt32Syms,&local_a8);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              ((this->globOptData).liveLossyInt32Syms,&local_a8);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              ((this->globOptData).liveFloat64Syms,&local_a8);
LAB_0041b7b2:
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (((this->globOptData).globOpt)->alloc,local_c0);
    this->upwardExposedUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (((this->globOptData).globOpt)->alloc,local_b8);
    this->upwardExposedFields = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    if (this->cloneStrCandidates != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (((this->globOptData).globOpt)->alloc,this->cloneStrCandidates);
      this->cloneStrCandidates = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    }
    if (local_138.head != (BVSparseNode *)0x0) {
      pBVar25 = (local_138.alloc)->bvFreeList;
      do {
        pBVar21 = local_138.head;
        local_138.head = pBVar21->next;
        pBVar21->next = pBVar25;
        pBVar25 = pBVar21;
      } while (local_138.head != (Type)0x0);
      (local_138.alloc)->bvFreeList = pBVar21;
    }
    if (local_e8.head != (BVSparseNode *)0x0) {
      pBVar25 = (local_e8.alloc)->bvFreeList;
      do {
        pBVar21 = local_e8.head;
        local_e8.head = pBVar21->next;
        pBVar21->next = pBVar25;
        pBVar25 = pBVar21;
      } while (local_e8.head != (Type)0x0);
      (local_e8.alloc)->bvFreeList = pBVar21;
    }
    if (local_108.head != (BVSparseNode *)0x0) {
      pBVar25 = (local_108.alloc)->bvFreeList;
      do {
        pBVar21 = local_108.head;
        local_108.head = pBVar21->next;
        pBVar21->next = pBVar25;
        pBVar25 = pBVar21;
      } while (local_108.head != (Type)0x0);
      (local_108.alloc)->bvFreeList = pBVar21;
    }
    if (local_a8.head != (BVSparseNode *)0x0) {
      pBVar25 = (local_a8.alloc)->bvFreeList;
      do {
        pBVar21 = local_a8.head;
        local_a8.head = pBVar21->next;
        pBVar21->next = pBVar25;
        pBVar25 = pBVar21;
      } while (local_a8.head != (Type)0x0);
      (local_a8.alloc)->bvFreeList = pBVar21;
    }
    return;
  }
  pBVar19 = this->func->m_nonTempLocalVars;
  if (pBVar19 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                        ,0x1133,"(this->func->m_nonTempLocalVars)","this->func->m_nonTempLocalVars")
    ;
    if (!bVar10) goto LAB_0041b8fa;
    *puVar12 = 0;
    pBVar19 = this->func->m_nonTempLocalVars;
  }
  iter.last = (NodeBase *)auStack_68;
  auStack_68 = (undefined1  [8])0x0;
  iter.super_Iterator.list =
       (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0;
  iter.super_Iterator.current = (NodeBase *)pJVar4;
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)iter.last,&local_a8,pBVar19);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
            ((this->globOptData).liveVarSyms,(BVSparse<Memory::JitArenaAllocator> *)auStack_68);
  pBVar19 = (BVSparse<Memory::JitArenaAllocator> *)auStack_68;
  BVSparse<Memory::JitArenaAllocator>::And
            (pBVar19,(this->globOptData).liveInt32Syms,this->func->m_nonTempLocalVars);
  do {
    pBVar19 = (BVSparse<Memory::JitArenaAllocator> *)pBVar19->head;
    if (pBVar19 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0041b62e;
  } while (((Type *)&pBVar19->alloc)->word == 0);
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar12 = 1;
  bVar10 = Js::Throw::ReportAssert
                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                      ,0x1139,"(tempBv.IsEmpty())",
                      "Type spec is disabled under debugger. How come did we get a non-temp local in liveInt32Syms?"
                     );
  if (bVar10) {
    *puVar12 = 0;
LAB_0041b62e:
    pBVar19 = (BVSparse<Memory::JitArenaAllocator> *)auStack_68;
    BVSparse<Memory::JitArenaAllocator>::And
              (pBVar19,(this->globOptData).liveLossyInt32Syms,this->func->m_nonTempLocalVars);
    do {
      pBVar19 = (BVSparse<Memory::JitArenaAllocator> *)pBVar19->head;
      if (pBVar19 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0041b6b3;
    } while (((Type *)&pBVar19->alloc)->word == 0);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                        ,0x113b,"(tempBv.IsEmpty())",
                        "Type spec is disabled under debugger. How come did we get a non-temp local in liveLossyInt32Syms?"
                       );
    if (bVar10) {
      *puVar12 = 0;
LAB_0041b6b3:
      pBVar19 = (BVSparse<Memory::JitArenaAllocator> *)auStack_68;
      BVSparse<Memory::JitArenaAllocator>::And
                (pBVar19,(this->globOptData).liveFloat64Syms,this->func->m_nonTempLocalVars);
      do {
        pBVar19 = (BVSparse<Memory::JitArenaAllocator> *)pBVar19->head;
        if (pBVar19 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0041b738;
      } while (((Type *)&pBVar19->alloc)->word == 0);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                          ,0x113d,"(tempBv.IsEmpty())",
                          "Type spec is disabled under debugger. How come did we get a non-temp local in liveFloat64Syms?"
                         );
      if (bVar10) {
        *puVar12 = 0;
LAB_0041b738:
        if (auStack_68 != (undefined1  [8])0x0) {
          auVar7 = auStack_68;
          pBVar24 = (Type_conflict)iter.super_Iterator.current[0x10].next;
          do {
            pBVar20 = (Type_conflict)auVar7;
            auVar7 = (undefined1  [8])
                     ((SListNodeBase<Memory::ArenaAllocator> *)&pBVar20->next)->next;
            ((SListNodeBase<Memory::ArenaAllocator> *)&pBVar20->next)->next = (Type)pBVar24;
            pBVar24 = pBVar20;
          } while (auVar7 != (undefined1  [8])0x0);
          iter.super_Iterator.current[0x10].next = (Type)pBVar20;
        }
        goto LAB_0041b779;
      }
    }
  }
LAB_0041b8fa:
  pcVar8 = (code *)invalidInstructionException();
  (*pcVar8)();
LAB_0041b0f0:
  BVar11 = BVSparse<Memory::JitArenaAllocator>::Test(&local_138,(pSVar14->super_Sym).m_id);
  if (BVar11 != '\0') goto LAB_0041ae68;
  bVar10 = false;
LAB_0041aeb5:
  if (local_b0 == (Loop *)0x0) {
    if (!bVar10 && (pSVar14->super_Sym).m_id <= ((this->globOptData).globOpt)->maxInitialSymID)
    goto LAB_0041b00f;
  }
  else {
    BVar11 = BVSparse<Memory::JitArenaAllocator>::Test
                       (this->loop->fieldPRESymStores,(pSVar14->super_Sym).m_id);
    uVar28 = (pSVar14->super_Sym).m_id;
    pGVar3 = (this->globOptData).globOpt;
    if ((!(bool)(bVar10 | pGVar3->maxInitialSymID < uVar28 | BVar11 != '\0')) &&
       (BVar11 = BVSparse<Memory::JitArenaAllocator>::Test(pGVar3->prePassCopyPropSym,uVar28),
       BVar11 == '\0')) {
LAB_0041b00f:
      pVVar5 = pTVar15->element;
      this_00 = pVVar5->valueInfo;
      pSVar16 = (StackSym *)this_00->symStore;
      if (pSVar16 == pSVar14 && pSVar16 != (StackSym *)0x0) {
        bVar10 = ValueInfo::IsVarConstant(this_00);
        if ((((!bVar10) &&
             (bVar10 = ValueInfo::HasIntConstantValue(pTVar15->element->valueInfo,false), !bVar10))
            && (BVSparse<Memory::JitArenaAllocator>::Set(&local_a8,(pSVar14->super_Sym).m_id),
               (pSVar14->super_Sym).m_kind == SymKindStack)) &&
           (bVar10 = StackSym::HasObjectTypeSym(pSVar14), bVar10)) {
          if ((pSVar14->super_Sym).m_kind != SymKindStack) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
            if (!bVar10) goto LAB_0041b8fa;
            *puVar12 = 0;
          }
          pSVar14 = StackSym::GetObjectTypeSym(pSVar14);
          BVSparse<Memory::JitArenaAllocator>::Set(&local_a8,(pSVar14->super_Sym).m_id);
        }
        BVSparse<Memory::JitArenaAllocator>::Set(&local_e8,pVVar5->valueNumber);
      }
      else {
        if (((pSVar14->super_Sym).m_kind == SymKindStack) &&
           (bVar10 = StackSym::HasObjectTypeSym(pSVar14), bVar10)) {
          if ((pSVar14->super_Sym).m_kind != SymKindStack) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
            if (!bVar10) goto LAB_0041b8fa;
            *puVar12 = 0;
          }
          pSVar16 = StackSym::GetObjectTypeSym(pSVar14);
          BVSparse<Memory::JitArenaAllocator>::Set(&local_a8,(pSVar16->super_Sym).m_id);
        }
        pSVar9 = iter.super_Iterator.list;
        pJVar4 = local_70->alloc;
        SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
        UnlinkCurrentNode((EditingIterator *)auStack_68);
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                  ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)pJVar4,
                   pSVar9,0x18);
        BVSparse<Memory::JitArenaAllocator>::Clear
                  ((this->globOptData).liveInt32Syms,(pSVar14->super_Sym).m_id);
        BVSparse<Memory::JitArenaAllocator>::Clear
                  ((this->globOptData).liveLossyInt32Syms,(pSVar14->super_Sym).m_id);
        BVSparse<Memory::JitArenaAllocator>::Clear
                  ((this->globOptData).liveFloat64Syms,(pSVar14->super_Sym).m_id);
        GlobOptBlockData::SetChangedSym(local_80,(Sym *)pSVar14);
      }
      goto LAB_0041ae68;
    }
  }
  if (((pSVar14->super_Sym).m_kind == SymKindProperty) &&
     (BVar11 = BVSparse<Memory::JitArenaAllocator>::Test
                         ((this->globOptData).liveFields,(pSVar14->super_Sym).m_id),
     pSVar9 = iter.super_Iterator.list, BVar11 == '\0')) {
    pJVar4 = local_70->alloc;
    SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
    UnlinkCurrentNode((EditingIterator *)auStack_68);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)pJVar4,pSVar9,
               0x18);
    BVSparse<Memory::JitArenaAllocator>::Clear
              ((this->globOptData).liveInt32Syms,(pSVar14->super_Sym).m_id);
    BVSparse<Memory::JitArenaAllocator>::Clear
              ((this->globOptData).liveLossyInt32Syms,(pSVar14->super_Sym).m_id);
    BVSparse<Memory::JitArenaAllocator>::Clear
              ((this->globOptData).liveFloat64Syms,(pSVar14->super_Sym).m_id);
  }
  else {
    pVVar5 = pTVar15->element;
    pSVar16 = (StackSym *)pVVar5->valueInfo->symStore;
    if ((pSVar16 != pSVar14 && pSVar16 != (StackSym *)0x0) &&
       ((BVSparse<Memory::JitArenaAllocator>::Set(&local_108,(pSVar16->super_Sym).m_id),
        (pSVar16->super_Sym).m_kind == SymKindStack &&
        (bVar10 = StackSym::HasObjectTypeSym(pSVar16), bVar10)))) {
      if ((pSVar16->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                            ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar10) goto LAB_0041b8fa;
        *puVar12 = 0;
      }
      pSVar14 = StackSym::GetObjectTypeSym(pSVar16);
      BVSparse<Memory::JitArenaAllocator>::Set(&local_108,(pSVar14->super_Sym).m_id);
    }
    BVSparse<Memory::JitArenaAllocator>::Set(&local_e8,pVVar5->valueNumber);
  }
  goto LAB_0041ae68;
}

Assistant:

void
BasicBlock::CleanUpValueMaps()
{
    // Don't do cleanup if it's been done recently.
    // Landing pad could get optimized twice...
    // We want the same info out the first and second time. So always cleanup.
    // Increasing the cleanup threshold count for asmjs to 500
    uint cleanupCount = (!this->globOptData.globOpt->GetIsAsmJSFunc()) ? CONFIG_FLAG(GoptCleanupThreshold) : CONFIG_FLAG(AsmGoptCleanupThreshold);
    if (!this->IsLandingPad() && this->globOptData.globOpt->instrCountSinceLastCleanUp < cleanupCount)
    {
        return;
    }
    this->globOptData.globOpt->instrCountSinceLastCleanUp = 0;

    JitArenaAllocator* tempAlloc = this->globOptData.globOpt->tempAlloc;

    GlobHashTable *thisTable = this->globOptData.symToValueMap;
    BVSparse<JitArenaAllocator> deadSymsBv(tempAlloc);
    BVSparse<JitArenaAllocator> keepAliveSymsBv(tempAlloc);
    BVSparse<JitArenaAllocator> availableValueNumbers(tempAlloc);
    availableValueNumbers.Copy(this->globOptData.globOpt->byteCodeConstantValueNumbersBv);
    BVSparse<JitArenaAllocator> *upwardExposedUses = this->upwardExposedUses;
    BVSparse<JitArenaAllocator> *upwardExposedFields = this->upwardExposedFields;
    bool isInLoop = !!this->loop;

    BVSparse<JitArenaAllocator> symsInCallSequence(tempAlloc);
    SListBase<IR::Opnd *> * callSequence = this->globOptData.callSequence;
    if (callSequence && !callSequence->Empty())
    {
        FOREACH_SLISTBASE_ENTRY(IR::Opnd *, opnd, callSequence)
        {
            StackSym * sym = opnd->GetStackSym();
            symsInCallSequence.Set(sym->m_id);
        }
    }
    NEXT_SLISTBASE_ENTRY;

    for (uint i = 0; i < thisTable->tableSize; i++)
    {
        FOREACH_SLISTBASE_ENTRY_EDITING(GlobHashBucket, bucket, &thisTable->table[i], iter)
        {
            Sym * sym = bucket.value;
            bool isSymUpwardExposed = upwardExposedUses->Test(sym->m_id) || upwardExposedFields->Test(sym->m_id);
            if (!isSymUpwardExposed && symsInCallSequence.Test(sym->m_id))
            {
                // Don't remove/shrink sym-value pair if the sym is referenced in callSequence even if the sym is dead according to backward data flow.
                // This is possible in some edge cases that an infinite loop is involved when evaluating parameter for a function (between StartCall and Call),
                // there is no backward data flow into the infinite loop block, but non empty callSequence still populates to it in this (forward) pass
                // which causes error when looking up value for the syms in callSequence (cannot find the value).
                // It would cause error to fill out the bailout information for the loop blocks.
                // Remove dead syms from callSequence has some risk because there are various associated counters which need to be consistent.
                continue;
            }
            // Make sure symbol was created before backward pass.
            // If symbols isn't upward exposed, mark it as dead.
            // If a symbol was copy-prop'd in a loop prepass, the upwardExposedUses info could be wrong.  So wait until we are out of the loop before clearing it.
            bool isSymFieldPRESymStore = isInLoop && this->loop->fieldPRESymStores->Test(sym->m_id);
            if ((SymID)sym->m_id <= this->globOptData.globOpt->maxInitialSymID && !isSymUpwardExposed && !isSymFieldPRESymStore
                && (!isInLoop || !this->globOptData.globOpt->prePassCopyPropSym->Test(sym->m_id)))
            {
                Value *val = bucket.element;
                ValueInfo *valueInfo = val->GetValueInfo();

                Sym *symStore = valueInfo->GetSymStore();

                if (symStore && symStore == sym)
                {
                    // Keep constants around, as we don't know if there will be further uses
                    if (!bucket.element->GetValueInfo()->IsVarConstant() && !bucket.element->GetValueInfo()->HasIntConstantValue())
                    {
                        // Symbol may still be a copy-prop candidate.  Wait before deleting it.
                        deadSymsBv.Set(sym->m_id);

                        // Make sure the type sym is added to the dead syms vector as well, because type syms are
                        // created in backward pass and so their symIds > maxInitialSymID.
                        if (sym->IsStackSym() && sym->AsStackSym()->HasObjectTypeSym())
                        {
                            deadSymsBv.Set(sym->AsStackSym()->GetObjectTypeSym()->m_id);
                        }
                    }
                    availableValueNumbers.Set(val->GetValueNumber());
                }
                else
                {
                    // Make sure the type sym is added to the dead syms vector as well, because type syms are
                    // created in backward pass and so their symIds > maxInitialSymID. Perhaps we could remove
                    // it explicitly here, but would it work alright with the iterator?
                    if (sym->IsStackSym() && sym->AsStackSym()->HasObjectTypeSym())
                    {
                        deadSymsBv.Set(sym->AsStackSym()->GetObjectTypeSym()->m_id);
                    }

                    // Not a copy-prop candidate; delete it right away.
                    iter.RemoveCurrent(thisTable->alloc);
                    this->globOptData.liveInt32Syms->Clear(sym->m_id);
                    this->globOptData.liveLossyInt32Syms->Clear(sym->m_id);
                    this->globOptData.liveFloat64Syms->Clear(sym->m_id);
                    this->globOptData.SetChangedSym(sym);
                }
            }
            else
            {
                if (sym->IsPropertySym() && !this->globOptData.liveFields->Test(sym->m_id))
                {
                    // Remove propertySyms which are not live anymore.
                    iter.RemoveCurrent(thisTable->alloc);
                    this->globOptData.liveInt32Syms->Clear(sym->m_id);
                    this->globOptData.liveLossyInt32Syms->Clear(sym->m_id);
                    this->globOptData.liveFloat64Syms->Clear(sym->m_id);
                }
                else
                {
                    // Look at the copy-prop candidate. We don't want to get rid of the data for a symbol which is
                    // a copy-prop candidate.
                    Value *val = bucket.element;
                    ValueInfo *valueInfo = val->GetValueInfo();

                    Sym *symStore = valueInfo->GetSymStore();

                    if (symStore && symStore != sym)
                    {
                        keepAliveSymsBv.Set(symStore->m_id);
                        if (symStore->IsStackSym() && symStore->AsStackSym()->HasObjectTypeSym())
                        {
                            keepAliveSymsBv.Set(symStore->AsStackSym()->GetObjectTypeSym()->m_id);
                        }
                    }
                    availableValueNumbers.Set(val->GetValueNumber());
                }
            }
        } NEXT_SLISTBASE_ENTRY_EDITING;
    }

    deadSymsBv.Minus(&keepAliveSymsBv);

    // Now cleanup exprToValueMap table
    ExprHashTable *thisExprTable = this->globOptData.exprToValueMap;
    bool oldHasCSECandidatesValue = this->globOptData.hasCSECandidates;  // Could be false if none need bailout.
    this->globOptData.hasCSECandidates = false;

    for (uint i = 0; i < thisExprTable->tableSize; i++)
    {
        FOREACH_SLISTBASE_ENTRY_EDITING(ExprHashBucket, bucket, &thisExprTable->table[i], iter)
        {
            ExprHash hash = bucket.value;
            ValueNumber src1ValNum = hash.GetSrc1ValueNumber();
            ValueNumber src2ValNum = hash.GetSrc2ValueNumber();

            // If src1Val or src2Val are not available anymore, no point keeping this CSE candidate
            bool removeCurrent = false;
            if ((src1ValNum && !availableValueNumbers.Test(src1ValNum))
                || (src2ValNum && !availableValueNumbers.Test(src2ValNum)))
            {
                removeCurrent = true;
            }
            else
            {
                // If we are keeping this value, make sure we also keep the symStore in the value table
                removeCurrent = true; // Remove by default, unless it's set to false later below.
                Value *val = bucket.element;
                if (val)
                {
                    Sym *symStore = val->GetValueInfo()->GetSymStore();
                    if (symStore)
                    {
                        Value *symStoreVal = this->globOptData.FindValue(symStore);

                        if (symStoreVal && symStoreVal->GetValueNumber() == val->GetValueNumber())
                        {
                            removeCurrent = false;
                            deadSymsBv.Clear(symStore->m_id);
                            if (symStore->IsStackSym() && symStore->AsStackSym()->HasObjectTypeSym())
                            {
                                deadSymsBv.Clear(symStore->AsStackSym()->GetObjectTypeSym()->m_id);
                            }
                        }
                    }
                }
            }

            if(removeCurrent)
            {
                iter.RemoveCurrent(thisExprTable->alloc);
            }
            else
            {
                this->globOptData.hasCSECandidates = oldHasCSECandidatesValue;
            }
        } NEXT_SLISTBASE_ENTRY_EDITING;
    }

    FOREACH_BITSET_IN_SPARSEBV(dead_id, &deadSymsBv)
    {
        thisTable->Clear(dead_id);
        Sym* sym = this->func->m_symTable->Find(dead_id);
        this->globOptData.SetChangedSym(sym);
    }
    NEXT_BITSET_IN_SPARSEBV;

    if (!deadSymsBv.IsEmpty())
    {
        if (this->func->IsJitInDebugMode())
        {
            // Do not remove non-temp local vars from liveVarSyms (i.e. do not let them become dead).
            // We will need to restore all initialized/used so far non-temp local during bail out.
            // (See BackwardPass::ProcessBailOutInfo)
            Assert(this->func->m_nonTempLocalVars);
            BVSparse<JitArenaAllocator> tempBv(tempAlloc);
            tempBv.Minus(&deadSymsBv, this->func->m_nonTempLocalVars);
            this->globOptData.liveVarSyms->Minus(&tempBv);
#if DBG
            tempBv.And(this->globOptData.liveInt32Syms, this->func->m_nonTempLocalVars);
            AssertMsg(tempBv.IsEmpty(), "Type spec is disabled under debugger. How come did we get a non-temp local in liveInt32Syms?");
            tempBv.And(this->globOptData.liveLossyInt32Syms, this->func->m_nonTempLocalVars);
            AssertMsg(tempBv.IsEmpty(), "Type spec is disabled under debugger. How come did we get a non-temp local in liveLossyInt32Syms?");
            tempBv.And(this->globOptData.liveFloat64Syms, this->func->m_nonTempLocalVars);
            AssertMsg(tempBv.IsEmpty(), "Type spec is disabled under debugger. How come did we get a non-temp local in liveFloat64Syms?");
#endif
        }
        else
        {
            this->globOptData.liveVarSyms->Minus(&deadSymsBv);
        }

        this->globOptData.liveInt32Syms->Minus(&deadSymsBv);
        this->globOptData.liveLossyInt32Syms->Minus(&deadSymsBv);
        this->globOptData.liveFloat64Syms->Minus(&deadSymsBv);
    }

    JitAdelete(this->globOptData.globOpt->alloc, upwardExposedUses);
    this->upwardExposedUses = nullptr;
    JitAdelete(this->globOptData.globOpt->alloc, upwardExposedFields);
    this->upwardExposedFields = nullptr;
    if (this->cloneStrCandidates)
    {
        JitAdelete(this->globOptData.globOpt->alloc, this->cloneStrCandidates);
        this->cloneStrCandidates = nullptr;
    }
}